

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateFtest(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  uint *puVar1;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar8;
  pointer pnVar9;
  cpp_dec_float<100U,_int,_void> *pcVar10;
  long lVar11;
  ulong uVar12;
  cpp_dec_float<100U,_int,_void> *pcVar13;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  theeps;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  uint local_118 [3];
  undefined3 uStack_10b;
  int iStack_108;
  bool bStack_104;
  undefined8 local_100;
  cpp_dec_float<100U,_int,_void> local_f8;
  cpp_dec_float<100U,_int,_void> *local_a0;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_90;
  DIdxSet *local_40;
  DIdxSet *local_38;
  
  pUVar2 = this->theFvec;
  (this->updateViols).super_IdxSet.num = 0;
  entertol(&local_90,this);
  lVar11 = (long)(pUVar2->thedelta).super_IdxSet.num;
  local_98 = pUVar2;
  if (0 < lVar11) {
    local_38 = &this->updateViols;
    local_a0 = &(this->m_pricingViol).m_backend;
    local_40 = &this->infeasibilities;
    uVar12 = lVar11 + 1;
    do {
      iVar7 = (local_98->thedelta).super_IdxSet.idx[uVar12 - 2];
      if (this->m_pricingViolUpToDate == true) {
        pcVar10 = &(this->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
        local_f8.data._M_elems[0] = local_90.m_backend.data._M_elems[0];
        local_f8.data._M_elems[1] = local_90.m_backend.data._M_elems[1];
        uVar4 = local_f8.data._M_elems._0_8_;
        local_f8.data._M_elems[2] = local_90.m_backend.data._M_elems[2];
        local_f8.data._M_elems[3] = local_90.m_backend.data._M_elems[3];
        local_f8.data._M_elems[0xc] = local_90.m_backend.data._M_elems[0xc];
        local_f8.data._M_elems[0xd] = local_90.m_backend.data._M_elems[0xd];
        local_f8.data._M_elems._56_5_ = local_90.m_backend.data._M_elems._56_5_;
        local_f8.data._M_elems[0xf]._1_3_ = local_90.m_backend.data._M_elems[0xf]._1_3_;
        local_f8.data._M_elems[8] = local_90.m_backend.data._M_elems[8];
        local_f8.data._M_elems[9] = local_90.m_backend.data._M_elems[9];
        local_f8.data._M_elems[10] = local_90.m_backend.data._M_elems[10];
        local_f8.data._M_elems[0xb] = local_90.m_backend.data._M_elems[0xb];
        local_f8.data._M_elems[4] = local_90.m_backend.data._M_elems[4];
        local_f8.data._M_elems[5] = local_90.m_backend.data._M_elems[5];
        local_f8.data._M_elems[6] = local_90.m_backend.data._M_elems[6];
        local_f8.data._M_elems[7] = local_90.m_backend.data._M_elems[7];
        local_f8.exp = local_90.m_backend.exp;
        local_f8.neg = local_90.m_backend.neg;
        local_f8.fpclass = local_90.m_backend.fpclass;
        local_f8.prec_elem = local_90.m_backend.prec_elem;
        local_f8.data._M_elems[0] = local_90.m_backend.data._M_elems[0];
        if (local_f8.data._M_elems[0] != 0 || local_90.m_backend.fpclass != cpp_dec_float_finite) {
          local_f8.neg = (bool)(local_90.m_backend.neg ^ 1);
        }
        local_f8.data._M_elems._0_8_ = uVar4;
        if (((local_90.m_backend.fpclass != cpp_dec_float_NaN) &&
            (pcVar10->fpclass != cpp_dec_float_NaN)) &&
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (pcVar10,&local_f8), iVar6 < 0)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (local_a0,&(this->theCoTest).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend);
        }
      }
      pnVar9 = (this->theFvec->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((*(fpclass_type *)((long)(pnVar9 + iVar7) + 0x48) == cpp_dec_float_NaN) ||
         (pnVar3 = (this->theUBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
         pnVar3[iVar7].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_003c83d2:
        pcVar10 = &pnVar9[iVar7].m_backend;
        pcVar13 = &(this->theLBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 0x10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems[6] = 0;
        local_f8.data._M_elems[7] = 0;
        local_f8.data._M_elems[8] = 0;
        local_f8.data._M_elems[9] = 0;
        local_f8.data._M_elems[10] = 0;
        local_f8.data._M_elems[0xb] = 0;
        local_f8.data._M_elems[0xc] = 0;
        local_f8.data._M_elems[0xd] = 0;
        local_f8.data._M_elems._56_5_ = 0;
        local_f8.data._M_elems[0xf]._1_3_ = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        if (&local_f8 != pcVar13) {
          if (&local_f8 != pcVar10) {
            local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
            local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
            local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
            local_f8.data._M_elems._24_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 6);
            local_f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 8);
            local_f8.data._M_elems._40_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 10);
            local_f8.data._M_elems._48_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 0xc);
            uVar4 = *(undefined8 *)((pcVar10->data)._M_elems + 0xe);
            local_f8.data._M_elems._56_5_ = SUB85(uVar4,0);
            local_f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_f8.exp = pcVar10->exp;
            local_f8.neg = pcVar10->neg;
            local_f8.fpclass = pcVar10->fpclass;
            local_f8.prec_elem = pcVar10->prec_elem;
          }
          goto LAB_003c8464;
        }
LAB_003c847c:
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 0x10;
        local_f8.neg = false;
        local_f8.exp = 0;
        local_f8.data._M_elems[0xf]._1_3_ = 0;
        local_f8.data._M_elems._56_5_ = 0;
        local_f8.data._M_elems[0xc] = 0;
        local_f8.data._M_elems[0xd] = 0;
        local_f8.data._M_elems[10] = 0;
        local_f8.data._M_elems[0xb] = 0;
        local_f8.data._M_elems[8] = 0;
        local_f8.data._M_elems[9] = 0;
        local_f8.data._M_elems[6] = 0;
        local_f8.data._M_elems[7] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_f8,pcVar10);
        if (local_f8.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite) {
          local_f8.neg = (bool)(local_f8.neg ^ 1);
        }
      }
      else {
        iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&pnVar9[iVar7].m_backend,&pnVar3[iVar7].m_backend);
        if (iVar6 < 1) {
          pnVar9 = (this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_003c83d2;
        }
        pcVar10 = &(this->theUBbound).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
        pcVar13 = &(this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
        local_f8.fpclass = cpp_dec_float_finite;
        local_f8.prec_elem = 0x10;
        local_f8.data._M_elems[0] = 0;
        local_f8.data._M_elems[1] = 0;
        local_f8.data._M_elems[2] = 0;
        local_f8.data._M_elems[3] = 0;
        local_f8.data._M_elems[4] = 0;
        local_f8.data._M_elems[5] = 0;
        local_f8.data._M_elems[6] = 0;
        local_f8.data._M_elems[7] = 0;
        local_f8.data._M_elems[8] = 0;
        local_f8.data._M_elems[9] = 0;
        local_f8.data._M_elems[10] = 0;
        local_f8.data._M_elems[0xb] = 0;
        local_f8.data._M_elems[0xc] = 0;
        local_f8.data._M_elems[0xd] = 0;
        local_f8.data._M_elems._56_5_ = 0;
        local_f8.data._M_elems[0xf]._1_3_ = 0;
        local_f8.exp = 0;
        local_f8.neg = false;
        if (&local_f8 == pcVar13) goto LAB_003c847c;
        if (&local_f8 != pcVar10) {
          local_f8.data._M_elems._0_8_ = *(undefined8 *)(pcVar10->data)._M_elems;
          local_f8.data._M_elems._8_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 2);
          local_f8.data._M_elems._16_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 4);
          local_f8.data._M_elems._24_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 6);
          local_f8.data._M_elems._32_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 8);
          local_f8.data._M_elems._40_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 10);
          local_f8.data._M_elems._48_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 0xc);
          uVar4 = *(undefined8 *)((pcVar10->data)._M_elems + 0xe);
          local_f8.data._M_elems._56_5_ = SUB85(uVar4,0);
          local_f8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
          local_f8.exp = pcVar10->exp;
          local_f8.neg = pcVar10->neg;
          local_f8.fpclass = pcVar10->fpclass;
          local_f8.prec_elem = pcVar10->prec_elem;
        }
LAB_003c8464:
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&local_f8,pcVar13);
      }
      pnVar9 = (this->theCoTest).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (uint *)((long)&pnVar9[iVar7].m_backend.data + 0x30);
      *(undefined8 *)puVar1 = local_f8.data._M_elems._48_8_;
      *(ulong *)(puVar1 + 2) =
           CONCAT35(local_f8.data._M_elems[0xf]._1_3_,local_f8.data._M_elems._56_5_);
      puVar1 = (uint *)((long)&pnVar9[iVar7].m_backend.data + 0x20);
      *(undefined8 *)puVar1 = local_f8.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_f8.data._M_elems._40_8_;
      puVar1 = (uint *)((long)&pnVar9[iVar7].m_backend.data + 0x10);
      *(undefined8 *)puVar1 = local_f8.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_f8.data._M_elems._24_8_;
      *(undefined8 *)&pnVar9[iVar7].m_backend.data = local_f8.data._M_elems._0_8_;
      *(undefined8 *)((long)&pnVar9[iVar7].m_backend.data + 8) = local_f8.data._M_elems._8_8_;
      pnVar9[iVar7].m_backend.exp = local_f8.exp;
      pnVar9[iVar7].m_backend.neg = local_f8.neg;
      pnVar9[iVar7].m_backend.fpclass = local_f8.fpclass;
      pnVar9[iVar7].m_backend.prec_elem = local_f8.prec_elem;
      if (this->sparsePricingLeave == true) {
        pcVar10 = &(this->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
        local_f8.data._M_elems[0] = local_90.m_backend.data._M_elems[0];
        local_f8.data._M_elems[1] = local_90.m_backend.data._M_elems[1];
        uVar4 = local_f8.data._M_elems._0_8_;
        local_f8.data._M_elems[2] = local_90.m_backend.data._M_elems[2];
        local_f8.data._M_elems[3] = local_90.m_backend.data._M_elems[3];
        local_f8.data._M_elems[0xc] = local_90.m_backend.data._M_elems[0xc];
        local_f8.data._M_elems[0xd] = local_90.m_backend.data._M_elems[0xd];
        local_f8.data._M_elems._56_5_ = local_90.m_backend.data._M_elems._56_5_;
        local_f8.data._M_elems[0xf]._1_3_ = local_90.m_backend.data._M_elems[0xf]._1_3_;
        local_f8.data._M_elems[8] = local_90.m_backend.data._M_elems[8];
        local_f8.data._M_elems[9] = local_90.m_backend.data._M_elems[9];
        local_f8.data._M_elems[10] = local_90.m_backend.data._M_elems[10];
        local_f8.data._M_elems[0xb] = local_90.m_backend.data._M_elems[0xb];
        local_f8.data._M_elems[4] = local_90.m_backend.data._M_elems[4];
        local_f8.data._M_elems[5] = local_90.m_backend.data._M_elems[5];
        local_f8.data._M_elems[6] = local_90.m_backend.data._M_elems[6];
        local_f8.data._M_elems[7] = local_90.m_backend.data._M_elems[7];
        local_f8.exp = local_90.m_backend.exp;
        local_f8.neg = local_90.m_backend.neg;
        local_f8.fpclass = local_90.m_backend.fpclass;
        local_f8.prec_elem = local_90.m_backend.prec_elem;
        local_f8.data._M_elems[0] = local_90.m_backend.data._M_elems[0];
        if (local_f8.data._M_elems[0] != 0 || local_90.m_backend.fpclass != cpp_dec_float_finite) {
          local_f8.neg = (bool)(local_90.m_backend.neg ^ 1);
        }
        local_f8.data._M_elems._0_8_ = uVar4;
        if (((local_90.m_backend.fpclass == cpp_dec_float_NaN) ||
            (pcVar10->fpclass == cpp_dec_float_NaN)) ||
           (iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (pcVar10,&local_f8), -1 < iVar6)) goto LAB_003c8599;
        if (this->m_pricingViolUpToDate == true) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                    (local_a0,&(this->theCoTest).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend);
        }
        if ((this->isInfeasible).data[iVar7] == 0) {
          DIdxSet::addIdx(local_40,iVar7);
          (this->isInfeasible).data[iVar7] = 1;
        }
        if (this->hyperPricingLeave == true) {
          DIdxSet::addIdx(local_38,iVar7);
        }
      }
      else {
LAB_003c8599:
        if (this->m_pricingViolUpToDate == true) {
          pcVar10 = &(this->theCoTest).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
          local_f8.data._M_elems[0] = local_90.m_backend.data._M_elems[0];
          local_f8.data._M_elems[1] = local_90.m_backend.data._M_elems[1];
          uVar4 = local_f8.data._M_elems._0_8_;
          local_f8.data._M_elems[2] = local_90.m_backend.data._M_elems[2];
          local_f8.data._M_elems[3] = local_90.m_backend.data._M_elems[3];
          local_f8.data._M_elems[0xc] = local_90.m_backend.data._M_elems[0xc];
          local_f8.data._M_elems[0xd] = local_90.m_backend.data._M_elems[0xd];
          local_f8.data._M_elems._56_5_ = local_90.m_backend.data._M_elems._56_5_;
          local_f8.data._M_elems[0xf]._1_3_ = local_90.m_backend.data._M_elems[0xf]._1_3_;
          local_f8.data._M_elems[8] = local_90.m_backend.data._M_elems[8];
          local_f8.data._M_elems[9] = local_90.m_backend.data._M_elems[9];
          local_f8.data._M_elems[10] = local_90.m_backend.data._M_elems[10];
          local_f8.data._M_elems[0xb] = local_90.m_backend.data._M_elems[0xb];
          local_f8.data._M_elems[4] = local_90.m_backend.data._M_elems[4];
          local_f8.data._M_elems[5] = local_90.m_backend.data._M_elems[5];
          local_f8.data._M_elems[6] = local_90.m_backend.data._M_elems[6];
          local_f8.data._M_elems[7] = local_90.m_backend.data._M_elems[7];
          local_f8.exp = local_90.m_backend.exp;
          local_f8.neg = local_90.m_backend.neg;
          local_f8.fpclass = local_90.m_backend.fpclass;
          local_f8.prec_elem = local_90.m_backend.prec_elem;
          local_f8.data._M_elems[0] = local_90.m_backend.data._M_elems[0];
          if (local_f8.data._M_elems[0] != 0 || local_90.m_backend.fpclass != cpp_dec_float_finite)
          {
            local_f8.neg = (bool)(local_90.m_backend.neg ^ 1);
          }
          local_f8.data._M_elems._0_8_ = uVar4;
          if (((local_90.m_backend.fpclass != cpp_dec_float_NaN) &&
              (pcVar10->fpclass != cpp_dec_float_NaN)) &&
             (iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                (pcVar10,&local_f8), iVar6 < 0)) {
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      (local_a0,&(this->theCoTest).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend);
          }
        }
      }
      uVar12 = uVar12 - 1;
    } while (1 < uVar12);
  }
  if (0 < this->boundflips) {
    a = Tolerances::epsilon((this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            )._tolerances.
                            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 0x10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems[6] = 0;
    local_f8.data._M_elems[7] = 0;
    local_f8.data._M_elems[8] = 0;
    local_f8.data._M_elems[9] = 0;
    local_f8.data._M_elems[10] = 0;
    local_f8.data._M_elems[0xb] = 0;
    local_f8.data._M_elems[0xc] = 0;
    local_f8.data._M_elems[0xd] = 0;
    local_f8.data._M_elems._56_5_ = 0;
    local_f8.data._M_elems[0xf]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_f8,a);
    pSVar8 = this->solveVector3;
    if (0 < (pSVar8->super_IdxSet).num) {
      local_98 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)&this->m_pricingViol;
      local_a0 = (cpp_dec_float<100U,_int,_void> *)&this->infeasibilities;
      lVar11 = 0;
      do {
        pnVar9 = (pSVar8->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar7 = (pSVar8->super_IdxSet).idx[lVar11];
        iStack_108 = pnVar9[iVar7].m_backend.exp;
        bStack_104 = pnVar9[iVar7].m_backend.neg;
        local_100._0_4_ = pnVar9[iVar7].m_backend.fpclass;
        local_100._4_4_ = pnVar9[iVar7].m_backend.prec_elem;
        local_138 = *(undefined1 (*) [16])((long)&pnVar9[iVar7].m_backend.data + 0x10);
        local_128 = *(undefined1 (*) [16])((long)&pnVar9[iVar7].m_backend.data + 0x20);
        puVar1 = (uint *)((long)&pnVar9[iVar7].m_backend.data + 0x30);
        local_118._0_8_ = *(undefined8 *)puVar1;
        uVar4 = *(undefined8 *)(puVar1 + 2);
        stack0xfffffffffffffef0 = (undefined5)uVar4;
        uStack_10b = (undefined3)((ulong)uVar4 >> 0x28);
        if ((bStack_104 == true) &&
           (local_148._0_4_ = (undefined4)*(undefined8 *)pnVar9[iVar7].m_backend.data._M_elems,
           local_148._0_4_ != 0 || (fpclass_type)local_100 != cpp_dec_float_finite)) {
          bStack_104 = false;
        }
        if ((((fpclass_type)local_100 != cpp_dec_float_NaN) &&
            (local_f8.fpclass != cpp_dec_float_NaN)) &&
           (local_148 = *(undefined1 (*) [16])&pnVar9[iVar7].m_backend.data,
           iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             ((cpp_dec_float<100U,_int,_void> *)local_148,&local_f8), 0 < iVar7)) {
          iVar7 = (this->solveVector3->super_IdxSet).idx[lVar11];
          if (this->m_pricingViolUpToDate == true) {
            pcVar10 = &(this->theCoTest).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
            local_148._8_4_ = local_90.m_backend.data._M_elems[2];
            local_148._12_4_ = local_90.m_backend.data._M_elems[3];
            local_148._0_4_ = local_90.m_backend.data._M_elems[0];
            local_148._4_4_ = local_90.m_backend.data._M_elems[1];
            auVar5 = local_148;
            local_118[0] = local_90.m_backend.data._M_elems[0xc];
            local_118[1] = local_90.m_backend.data._M_elems[0xd];
            stack0xfffffffffffffef0 = local_90.m_backend.data._M_elems._56_5_;
            uStack_10b = local_90.m_backend.data._M_elems[0xf]._1_3_;
            local_128._8_4_ = local_90.m_backend.data._M_elems[10];
            local_128._12_4_ = local_90.m_backend.data._M_elems[0xb];
            local_128._0_4_ = local_90.m_backend.data._M_elems[8];
            local_128._4_4_ = local_90.m_backend.data._M_elems[9];
            local_138._8_4_ = local_90.m_backend.data._M_elems[6];
            local_138._12_4_ = local_90.m_backend.data._M_elems[7];
            local_138._0_4_ = local_90.m_backend.data._M_elems[4];
            local_138._4_4_ = local_90.m_backend.data._M_elems[5];
            iStack_108 = local_90.m_backend.exp;
            bStack_104 = local_90.m_backend.neg;
            local_100._0_4_ = local_90.m_backend.fpclass;
            local_100._4_4_ = local_90.m_backend.prec_elem;
            local_148._0_4_ = local_90.m_backend.data._M_elems[0];
            if (local_148._0_4_ != 0 || local_90.m_backend.fpclass != cpp_dec_float_finite) {
              bStack_104 = (bool)(local_90.m_backend.neg ^ 1);
            }
            local_148 = auVar5;
            if (((local_90.m_backend.fpclass != cpp_dec_float_NaN) &&
                (pcVar10->fpclass != cpp_dec_float_NaN)) &&
               (iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (pcVar10,(cpp_dec_float<100U,_int,_void> *)local_148), iVar6 < 0))
            {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                        ((cpp_dec_float<100U,_int,_void> *)local_98,
                         &(this->theCoTest).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend);
            }
          }
          pnVar9 = (this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((*(fpclass_type *)((long)(pnVar9 + iVar7) + 0x48) == cpp_dec_float_NaN) ||
             (pnVar3 = (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
             pnVar3[iVar7].m_backend.fpclass == cpp_dec_float_NaN)) {
LAB_003c8992:
            pcVar10 = &pnVar9[iVar7].m_backend;
            pcVar13 = &(this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
            local_100._0_4_ = cpp_dec_float_finite;
            local_100._4_4_ = 0x10;
            local_148 = (undefined1  [16])0x0;
            local_138 = (undefined1  [16])0x0;
            local_128 = (undefined1  [16])0x0;
            local_118[0] = 0;
            local_118[1] = 0;
            stack0xfffffffffffffef0 = 0;
            uStack_10b = 0;
            iStack_108 = 0;
            bStack_104 = false;
            if ((cpp_dec_float<100U,_int,_void> *)local_148 != pcVar13) {
              if ((cpp_dec_float<100U,_int,_void> *)local_148 != pcVar10) {
                local_148 = *(undefined1 (*) [16])(pcVar10->data)._M_elems;
                local_138 = *(undefined1 (*) [16])((pcVar10->data)._M_elems + 4);
                local_128 = *(undefined1 (*) [16])((pcVar10->data)._M_elems + 8);
                local_118._0_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 0xc);
                uVar4 = *(undefined8 *)((pcVar10->data)._M_elems + 0xe);
                stack0xfffffffffffffef0 = (undefined5)uVar4;
                uStack_10b = (undefined3)((ulong)uVar4 >> 0x28);
                iStack_108 = pcVar10->exp;
                bStack_104 = pcVar10->neg;
                local_100._0_4_ = pcVar10->fpclass;
                local_100._4_4_ = pcVar10->prec_elem;
              }
              goto LAB_003c8a14;
            }
LAB_003c8a2c:
            local_100._0_4_ = cpp_dec_float_finite;
            local_100._4_4_ = 0x10;
            bStack_104 = false;
            iStack_108 = 0;
            uStack_10b = 0;
            stack0xfffffffffffffef0 = 0;
            local_118[0] = 0;
            local_118[1] = 0;
            local_128 = (undefined1  [16])0x0;
            local_138 = (undefined1  [16])0x0;
            local_148 = (undefined1  [16])0x0;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      ((cpp_dec_float<100U,_int,_void> *)local_148,pcVar10);
            if (local_148._0_4_ != 0 || (fpclass_type)local_100 != cpp_dec_float_finite) {
              bStack_104 = (bool)(bStack_104 ^ 1);
            }
          }
          else {
            iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&pnVar9[iVar7].m_backend,&pnVar3[iVar7].m_backend);
            if (iVar6 < 1) {
              pnVar9 = (this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_003c8992;
            }
            pcVar10 = &(this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
            pcVar13 = &(this->theFvec->
                       super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
            local_100._0_4_ = cpp_dec_float_finite;
            local_100._4_4_ = 0x10;
            local_148 = (undefined1  [16])0x0;
            local_138 = (undefined1  [16])0x0;
            local_128 = (undefined1  [16])0x0;
            local_118[0] = 0;
            local_118[1] = 0;
            stack0xfffffffffffffef0 = 0;
            uStack_10b = 0;
            iStack_108 = 0;
            bStack_104 = false;
            if ((cpp_dec_float<100U,_int,_void> *)local_148 == pcVar13) goto LAB_003c8a2c;
            if ((cpp_dec_float<100U,_int,_void> *)local_148 != pcVar10) {
              local_148 = *(undefined1 (*) [16])(pcVar10->data)._M_elems;
              local_138 = *(undefined1 (*) [16])((pcVar10->data)._M_elems + 4);
              local_128 = *(undefined1 (*) [16])((pcVar10->data)._M_elems + 8);
              local_118._0_8_ = *(undefined8 *)((pcVar10->data)._M_elems + 0xc);
              uVar4 = *(undefined8 *)((pcVar10->data)._M_elems + 0xe);
              stack0xfffffffffffffef0 = (undefined5)uVar4;
              uStack_10b = (undefined3)((ulong)uVar4 >> 0x28);
              iStack_108 = pcVar10->exp;
              bStack_104 = pcVar10->neg;
              local_100._0_4_ = pcVar10->fpclass;
              local_100._4_4_ = pcVar10->prec_elem;
            }
LAB_003c8a14:
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                      ((cpp_dec_float<100U,_int,_void> *)local_148,pcVar13);
          }
          pnVar9 = (this->theCoTest).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar1 = (uint *)((long)&pnVar9[iVar7].m_backend.data + 0x30);
          *(undefined8 *)puVar1 = local_118._0_8_;
          *(ulong *)(puVar1 + 2) = CONCAT35(uStack_10b,stack0xfffffffffffffef0);
          puVar1 = (uint *)((long)&pnVar9[iVar7].m_backend.data + 0x20);
          *(undefined8 *)puVar1 = local_128._0_8_;
          *(undefined8 *)(puVar1 + 2) = local_128._8_8_;
          puVar1 = (uint *)((long)&pnVar9[iVar7].m_backend.data + 0x10);
          *(undefined8 *)puVar1 = local_138._0_8_;
          *(undefined8 *)(puVar1 + 2) = local_138._8_8_;
          *(undefined8 *)&pnVar9[iVar7].m_backend.data = local_148._0_8_;
          *(undefined8 *)((long)&pnVar9[iVar7].m_backend.data + 8) = local_148._8_8_;
          pnVar9[iVar7].m_backend.exp = iStack_108;
          pnVar9[iVar7].m_backend.neg = bStack_104;
          pnVar9[iVar7].m_backend.fpclass = (fpclass_type)local_100;
          pnVar9[iVar7].m_backend.prec_elem = local_100._4_4_;
          if (this->sparsePricingLeave == true) {
            pcVar10 = &(this->theCoTest).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
            local_118[0] = local_90.m_backend.data._M_elems[0xc];
            local_118[1] = local_90.m_backend.data._M_elems[0xd];
            stack0xfffffffffffffef0 = local_90.m_backend.data._M_elems._56_5_;
            uStack_10b = local_90.m_backend.data._M_elems[0xf]._1_3_;
            iStack_108 = local_90.m_backend.exp;
            bStack_104 = local_90.m_backend.neg;
            local_100._0_4_ = local_90.m_backend.fpclass;
            local_100._4_4_ = local_90.m_backend.prec_elem;
            local_148._0_4_ = local_90.m_backend.data._M_elems[0];
            if (local_148._0_4_ != 0 || local_90.m_backend.fpclass != cpp_dec_float_finite) {
              bStack_104 = (bool)(local_90.m_backend.neg ^ 1);
            }
            if (((local_90.m_backend.fpclass != cpp_dec_float_NaN) &&
                (pcVar10->fpclass != cpp_dec_float_NaN)) &&
               (iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (pcVar10,(cpp_dec_float<100U,_int,_void> *)local_148), iVar6 < 0))
            {
              if (this->m_pricingViolUpToDate == true) {
                boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                          ((cpp_dec_float<100U,_int,_void> *)local_98,
                           &(this->theCoTest).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend);
              }
              if ((this->isInfeasible).data[iVar7] == 0) {
                DIdxSet::addIdx((DIdxSet *)local_a0,iVar7);
                (this->isInfeasible).data[iVar7] = 1;
              }
              goto LAB_003c8c1e;
            }
          }
          if (this->m_pricingViolUpToDate == true) {
            pcVar10 = &(this->theCoTest).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend;
            local_118[0] = local_90.m_backend.data._M_elems[0xc];
            local_118[1] = local_90.m_backend.data._M_elems[0xd];
            stack0xfffffffffffffef0 = local_90.m_backend.data._M_elems._56_5_;
            uStack_10b = local_90.m_backend.data._M_elems[0xf]._1_3_;
            iStack_108 = local_90.m_backend.exp;
            bStack_104 = local_90.m_backend.neg;
            local_100._0_4_ = local_90.m_backend.fpclass;
            local_100._4_4_ = local_90.m_backend.prec_elem;
            local_148._0_4_ = local_90.m_backend.data._M_elems[0];
            if (local_148._0_4_ != 0 || local_90.m_backend.fpclass != cpp_dec_float_finite) {
              bStack_104 = (bool)(local_90.m_backend.neg ^ 1);
            }
            if (((local_90.m_backend.fpclass != cpp_dec_float_NaN) &&
                (pcVar10->fpclass != cpp_dec_float_NaN)) &&
               (iVar6 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (pcVar10,(cpp_dec_float<100U,_int,_void> *)local_148), iVar6 < 0))
            {
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                        ((cpp_dec_float<100U,_int,_void> *)local_98,
                         &(this->theCoTest).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend);
            }
          }
        }
LAB_003c8c1e:
        lVar11 = lVar11 + 1;
        pSVar8 = this->solveVector3;
      } while (lVar11 < (pSVar8->super_IdxSet).num);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::updateFtest()
{
   const IdxSet& idx = theFvec->idx();
   VectorBase<R>& ftest = theCoTest;      // |== fTest()|
   assert(&ftest == &fTest());

   assert(type() == LEAVE);

   updateViols.clear();
   R theeps = entertol();

   for(int j = idx.size() - 1; j >= 0; --j)
   {
      int i = idx.index(j);

      if(m_pricingViolUpToDate && ftest[i] < -theeps)
         // violation was present before this iteration
         m_pricingViol += ftest[i];

      ftest[i] = ((*theFvec)[i] > theUBbound[i])
                 ? theUBbound[i] - (*theFvec)[i]
                 : (*theFvec)[i] - theLBbound[i];

      if(sparsePricingLeave && ftest[i] < -theeps)
      {
         assert(remainingRoundsLeave == 0);

         if(m_pricingViolUpToDate)
            m_pricingViol -= ftest[i];

         if(isInfeasible[i] == SPxPricer<R>::NOT_VIOLATED)
         {
            // this can cause problems - we cannot keep on adding indeces to infeasibilities,
            // because they are not deleted in hyper mode...
            //             if( !hyperPricingLeave )
            infeasibilities.addIdx(i);
            isInfeasible[i] = SPxPricer<R>::VIOLATED;
         }

         if(hyperPricingLeave)
            updateViols.addIdx(i);
      }
      else if(m_pricingViolUpToDate && ftest[i] < -theeps)
         m_pricingViol -= ftest[i];
   }

   // if boundflips were performed, we need to update these indices as well
   if(boundflips > 0)
   {
      R eps = epsilon();

      for(int j = 0; j < solveVector3->size(); ++j)
      {
         if(spxAbs(solveVector3->value(j)) > eps)
         {
            int i = solveVector3->index(j);

            if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol += ftest[i];

            ftest[i] = ((*theFvec)[i] > theUBbound[i]) ? theUBbound[i] - (*theFvec)[i] :
                       (*theFvec)[i] - theLBbound[i];

            if(sparsePricingLeave && ftest[i] < -theeps)
            {
               assert(remainingRoundsLeave == 0);

               if(m_pricingViolUpToDate)
                  m_pricingViol -= ftest[i];

               if(!isInfeasible[i])
               {
                  infeasibilities.addIdx(i);
                  isInfeasible[i] = true;
               }
            }
            else if(m_pricingViolUpToDate && ftest[i] < -theeps)
               m_pricingViol -= ftest[i];
         }
      }
   }
}